

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_memory.cpp
# Opt level: O2

void __thiscall LiteScript::_BasicMemory_1::FlagsErase(_BasicMemory_1 *this)

{
  uint uVar1;
  uint uVar2;
  _BasicMemory_0 *p_Var3;
  uint i;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    p_Var3 = (this->arr)._M_elems[lVar4];
    if (p_Var3 != (_BasicMemory_0 *)0x0) {
      uVar1 = p_Var3->count;
      uVar2 = *p_Var3->Count;
      _BasicMemory_0::FlagsErase(p_Var3);
      p_Var3 = (this->arr)._M_elems[lVar4];
      if ((uVar1 == 0x100) && (p_Var3->count != 0x100)) {
        (this->nfull)._M_elems[lVar4] = this->first_nfull;
        this->first_nfull = (short)lVar4;
      }
      if (uVar2 != *p_Var3->Count) {
        this->count = this->count - 1;
      }
    }
  }
  return;
}

Assistant:

void LiteScript::_BasicMemory_1::FlagsErase() {
    for (unsigned int i = 0, sz = LITESCRIPT_MEMORY_1_SIZE; i < sz; i++) {
        if (this->arr[i] != nullptr) {
            bool wasFull = this->arr[i]->isFull();
            unsigned int nb = this->arr[i]->Count;
            this->arr[i]->FlagsErase();
            // Si le block n'est plus plein, on le place en premier
            if (wasFull && !this->arr[i]->isFull()) {
                this->nfull[i] = this->first_nfull;
                this->first_nfull = (short)i;
            }
            // Si le nombre d'objet à diminué, on décrémente le compteur
            if (nb != this->arr[i]->Count)
                this->count--;
        }
    }
}